

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O1

void __thiscall
GuidedMeshNormalFiltering::getAllGuidedNeighborGMNF
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          *all_guided_neighbor)

{
  FaceIter FVar1;
  void *pvStack_58;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  FaceIter f_it;
  
  pvStack_58 = (void *)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    FVar1 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    if ((BaseHandle)f_it.mesh_._0_4_ == FVar1.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        (mesh_ptr)
        face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == FVar1.mesh_) break;
    MeshDenoisingBase::getFaceNeighbor
              (&this->super_MeshDenoisingBase,mesh,(FaceHandle)f_it.mesh_._0_4_,kVertexBased,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&pvStack_58);
    if (face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start ==
        face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
      _M_realloc_insert<OpenMesh::FaceHandle_const&>
                ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)&pvStack_58,
                 (iterator)
                 face_neighbor.
                 super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start,(FaceHandle *)&f_it);
    }
    else {
      ((face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = f_it.mesh_._0_4_;
      face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_start =
           face_neighbor.
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator=
              ((all_guided_neighbor->
               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + f_it.mesh_._0_4_,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&pvStack_58);
    f_it.mesh_._0_4_ = f_it.mesh_._0_4_ + 1;
    if (f_it.mesh_._4_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  if (pvStack_58 != (void *)0x0) {
    operator_delete(pvStack_58);
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getAllGuidedNeighborGMNF(TriMesh &mesh, std::vector<std::vector<TriMesh::FaceHandle> > &all_guided_neighbor)
{
    std::vector<TriMesh::FaceHandle> face_neighbor;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        getVertexBasedFaceNeighbor(mesh, *f_it, face_neighbor);
        face_neighbor.push_back(*f_it);
        all_guided_neighbor[f_it->idx()] = face_neighbor;
    }
}